

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O0

void device_reset_multipcm(void *info)

{
  int local_1c;
  INT32 slot;
  MultiPCM *ptChip;
  void *info_local;
  
  for (local_1c = 0; local_1c < 0x1c; local_1c = local_1c + 1) {
    *(char *)((long)info + (long)local_1c * 0x98 + 8) = (char)local_1c;
    *(undefined1 *)((long)info + (long)local_1c * 0x98 + 0x11) = 0;
  }
  return;
}

Assistant:

static void device_reset_multipcm(void *info)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	INT32 slot;
	
	for (slot = 0; slot < 28; ++slot)
	{
		ptChip->slots[slot].slot_index = slot;
		ptChip->slots[slot].playing = 0;
	}
	
	return;
}